

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O2

MapPalette * build_greyscale_palette(World *world,MapPalette *palette,float luminance)

{
  byte bVar1;
  byte bVar2;
  uint8_t r;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  array<Color,_13UL> *this;
  reference pvVar8;
  size_t i;
  size_type __n;
  float fVar9;
  float fVar10;
  Color local_3c;
  World *local_38;
  
  local_38 = world;
  this = (array<Color,_13UL> *)operator_new(0x34);
  uVar3 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2);
  uVar4 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4);
  uVar5 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6);
  uVar6 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8);
  uVar7 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)this->_M_elems = *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems;
  *(undefined8 *)(this->_M_elems + 2) = uVar3;
  *(undefined8 *)(this->_M_elems + 4) = uVar4;
  *(undefined8 *)(this->_M_elems + 6) = uVar5;
  *(undefined8 *)(this->_M_elems + 8) = uVar6;
  *(undefined8 *)(this->_M_elems + 10) = uVar7;
  this->_M_elems[0xc] = (palette->super_array<Color,_13UL>)._M_elems[0xc];
  for (__n = 0; __n != 0xd; __n = __n + 1) {
    pvVar8 = std::array<Color,_13UL>::at(this,__n);
    bVar1 = pvVar8->_r;
    pvVar8 = std::array<Color,_13UL>::at(this,__n);
    bVar2 = pvVar8->_g;
    pvVar8 = std::array<Color,_13UL>::at(this,__n);
    fVar9 = (float)(((uint)pvVar8->_b + (uint)bVar2 + (uint)bVar1) / 3 & 0xff) * luminance;
    fVar10 = 255.0;
    if (fVar9 <= 255.0) {
      fVar10 = fVar9;
    }
    r = (uint8_t)(int)fVar10;
    Color::Color(&local_3c,r,r,r);
    this->_M_elems[__n] = local_3c;
  }
  World::add_map_palette(local_38,(MapPalette *)this);
  return (MapPalette *)this;
}

Assistant:

static MapPalette* build_greyscale_palette(World& world, MapPalette* palette, float luminance = 1.f)
{
    MapPalette* pal = new MapPalette(*palette);
    for(size_t i=0 ; i<pal->size() ; ++i)
    {
        uint8_t average = (pal->at(i).r() + pal->at(i).g() + pal->at(i).b()) / 3;
        average = (uint8_t)std::min((float)average * luminance, 255.f);
        (*pal)[i] = { average, average, average };
    }

//    Color color_red = Color(0xC0, 0x00, 0x00);
//
//    MapPalette* pal = new MapPalette({
//            color_red, color_red, color_red, color_red, color_red, color_red, color_red,
//            color_red, color_red, color_red, color_red, color_red, color_red
//    });

    world.add_map_palette(pal);
    return pal;
}